

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O1

void Logger::printLine<unsigned_int,unsigned_long>(char *text,uint *args,unsigned_long *args_1)

{
  char *extraout_RDX;
  unsigned_long *in_R8;
  string_view text_00;
  string message;
  string local_28;
  
  tinyformat::format<unsigned_int,unsigned_long>
            (&local_28,(tinyformat *)text,(char *)args,(uint *)args_1,in_R8);
  text_00._M_str = extraout_RDX;
  text_00._M_len = (size_t)local_28._M_dataplus._M_p;
  printLine((Logger *)local_28._M_string_length,text_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}